

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void prf_node_clear(prf_node_t *node)

{
  if (node != (prf_node_t *)0x0) {
    node->opcode = 0;
    node->length = 4;
    *(undefined8 *)&node->flags = 0;
    *(undefined8 *)((long)&node->data + 4) = 0;
    *(undefined8 *)((long)&node->children + 4) = 0;
    *(undefined8 *)((long)&node->parent + 4) = 0;
    *(undefined4 *)((long)&node->userdata + 4) = 0;
  }
  return;
}

Assistant:

void
prf_node_clear(
    prf_node_t * node )
{
    if ( node != NULL ) {
        node->opcode = 0;
        node->length = 4;
        node->flags = 0;
        node->data = NULL;
        node->children = NULL;
        node->parent = NULL;
        node->userdata = NULL;
    }
}